

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O2

context_t * ZmqContextManager::getContext(string *contextName)

{
  context_t *pcVar1;
  _Alloc_hider local_18;
  
  getContextPointer((ZmqContextManager *)&stack0xffffffffffffffe8,contextName);
  pcVar1 = *(context_t **)(local_18._M_p + 0x20);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return pcVar1;
}

Assistant:

zmq::context_t& ZmqContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}